

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionPair.h
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionPair::Set
          (ChCollisionPair *this,ChGeometry *mgeo1,ChGeometry *mgeo2,ChVector<double> *mp1,
          ChVector<double> *mp2,ChVector<float> *mnormal,float *mreaction_cache)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM3_Qa;
  undefined1 auVar5 [16];
  undefined8 in_XMM5_Qb;
  
  this->geo1 = mgeo1;
  this->geo2 = mgeo2;
  if (&this->p1 != mp1) {
    (this->p1).m_data[0] = mp1->m_data[0];
    (this->p1).m_data[1] = mp1->m_data[1];
    (this->p1).m_data[2] = mp1->m_data[2];
  }
  if (&this->p2 != mp2) {
    (this->p2).m_data[0] = mp2->m_data[0];
    (this->p2).m_data[1] = mp2->m_data[1];
    (this->p2).m_data[2] = mp2->m_data[2];
  }
  if (&this->normal != mnormal) {
    (this->normal).m_data[0] = mnormal->m_data[0];
    (this->normal).m_data[1] = mnormal->m_data[1];
    (this->normal).m_data[2] = mnormal->m_data[2];
  }
  this->just_intersection = false;
  this->reactions_cache = mreaction_cache;
  auVar5._0_8_ = (double)mnormal->m_data[0];
  auVar5._8_8_ = in_XMM3_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = mp2->m_data[0] - mp1->m_data[0];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (mp2->m_data[1] - mp1->m_data[1]) * (double)mnormal->m_data[1];
  auVar1 = vfmadd231sd_fma(auVar3,auVar1,auVar5);
  auVar2._0_8_ = (double)mnormal->m_data[2];
  auVar2._8_8_ = in_XMM5_Qb;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = mp2->m_data[2] - mp1->m_data[2];
  auVar1 = vfmadd213sd_fma(auVar2,auVar4,auVar1);
  this->norm_dist = (double)(float)auVar1._0_8_;
  return;
}

Assistant:

void Set(geometry::ChGeometry* mgeo1,
             geometry::ChGeometry* mgeo2,
             const ChVector<>& mp1,
             const ChVector<>& mp2,
             const ChVector<float>& mnormal,
             float* mreaction_cache = 0) {
        geo1 = mgeo1;
        geo2 = mgeo2;
        p1 = mp1;
        p2 = mp2;
        normal = mnormal;
        just_intersection = false;
        reactions_cache = mreaction_cache;

        norm_dist = Vdot(mnormal, mp2 - mp1);
    }